

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void save_load(stagewise_poly *poly,io_buf *model_file,bool read,bool text)

{
  size_t sVar1;
  long in_RSI;
  long in_RDI;
  stringstream msg;
  stringstream *msg_00;
  char *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  io_buf *in_stack_fffffffffffffe68;
  
  sVar1 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar1 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
    msg_00 = *(stringstream **)(in_RDI + 0x28);
    sVar1 = depthsbits_sizeof((stagewise_poly *)0x2d5b96);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50,SUB81(sVar1 >> 0x38,0),msg_00,
               SUB81((ulong)in_RSI >> 0x38,0));
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe60);
  }
  return;
}

Assistant:

void save_load(stagewise_poly &poly, io_buf &model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;
    bin_text_read_write_fixed(
        model_file, (char *)poly.depthsbits, (uint32_t)depthsbits_sizeof(poly), "", read, msg, text);
  }
  // unfortunately, following can't go here since save_load called before gd::save_load and thus
  // weight vector state uninitialiazed.
  //#ifdef DEBUG
  //      cout << "Sanity check after save_load... " << flush;
  //      sanity_check_state(poly);
  //      cout << "done" << endl;
  //#endif //DEBUG
}